

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O2

void Minisat::selectionSort<long,Minisat::LessThan_default<long>>(long array,uint size)

{
  undefined8 uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar3 = 1;
  if (1 < (int)size) {
    uVar3 = size;
  }
  uVar4 = 1;
  for (uVar5 = 0; uVar5 != uVar3 - 1; uVar5 = uVar5 + 1) {
    uVar7 = uVar5 & 0xffffffff;
    for (uVar6 = uVar4; lVar8 = (long)(int)uVar7, size != uVar6; uVar6 = uVar6 + 1) {
      uVar2 = uVar6 & 0xffffffff;
      if (*(long *)(array + lVar8 * 8) <= *(long *)(array + uVar6 * 8)) {
        uVar2 = uVar7;
      }
      uVar7 = uVar2;
    }
    uVar1 = *(undefined8 *)(array + uVar5 * 8);
    *(undefined8 *)(array + uVar5 * 8) = *(undefined8 *)(array + lVar8 * 8);
    *(undefined8 *)(array + lVar8 * 8) = uVar1;
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void selectionSort(T *array, int size, LessThan lt)
{
    int i, j, best_i;
    T tmp;

    for (i = 0; i < size - 1; i++) {
        best_i = i;
        for (j = i + 1; j < size; j++) {
            if (lt(array[j], array[best_i])) best_i = j;
        }
        tmp = array[i];
        array[i] = array[best_i];
        array[best_i] = tmp;
    }
}